

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O2

uint64_t yactfr::internal::anon_unknown_0::readFlUIntBe6At6(uint8_t *buf)

{
  return (ulong)((*buf & 3) << 4 | (uint)(buf[1] >> 4));
}

Assistant:

std::uint64_t readFlUIntBe6At6(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[0];
    res <<= 4;
    res |= (buf[1] >> 4);
    res &= UINT64_C(0x3f);
    return res;
}